

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::Effect(Map *this,MapEffect effect,uchar param)

{
  undefined7 in_register_00000031;
  _List_node_base *p_Var1;
  PacketBuilder builder;
  PacketBuilder local_50;
  
  PacketBuilder::PacketBuilder(&local_50,PACKET_EFFECT,PACKET_USE,2);
  PacketBuilder::AddChar(&local_50,(int)CONCAT71(in_register_00000031,effect));
  PacketBuilder::AddChar(&local_50,(uint)param);
  p_Var1 = (_List_node_base *)&this->characters;
  while (p_Var1 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->characters) {
    Character::Send((Character *)p_Var1[1]._M_next,&local_50);
  }
  PacketBuilder::~PacketBuilder(&local_50);
  return;
}

Assistant:

void Map::Effect(MapEffect effect, unsigned char param)
{
	PacketBuilder builder(PACKET_EFFECT, PACKET_USE, 2);
	builder.AddChar(effect);
	builder.AddChar(param);

	UTIL_FOREACH(this->characters, character)
	{
		character->Send(builder);
	}
}